

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

CharClass<unsigned_char> * __thiscall
Centaurus::CharClass<unsigned_char>::operator~
          (CharClass<unsigned_char> *__return_storage_ptr__,CharClass<unsigned_char> *this)

{
  byte bVar1;
  bool bVar2;
  uchar uVar3;
  byte bVar4;
  pointer pRVar5;
  uchar local_69;
  Range<unsigned_char> *local_68;
  uchar local_59;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_58;
  Range<unsigned_char> *local_50;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_38;
  byte local_29;
  const_iterator cStack_28;
  uchar last_end;
  const_iterator i;
  CharClass<unsigned_char> *this_local;
  CharClass<unsigned_char> *cc;
  
  i._M_current._7_1_ = 0;
  CharClass(__return_storage_ptr__);
  cStack_28 = std::
              vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
              ::cbegin(&this->m_ranges);
  local_29 = 1;
  local_38._M_current =
       (Range<unsigned_char> *)
       std::
       vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
       cend(&this->m_ranges);
  bVar2 = __gnu_cxx::operator!=(&stack0xffffffffffffffd8,&local_38);
  if (bVar2) {
    pRVar5 = __gnu_cxx::
             __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
             ::operator->(&stack0xffffffffffffffd8);
    uVar3 = Range<unsigned_char>::start(pRVar5);
    if (uVar3 == '\x01') {
      pRVar5 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
               ::operator->(&stack0xffffffffffffffd8);
      local_29 = Range<unsigned_char>::end(pRVar5);
      local_50 = (Range<unsigned_char> *)
                 __gnu_cxx::
                 __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                 ::operator++(&stack0xffffffffffffffd8,0);
    }
  }
  while( true ) {
    local_58._M_current =
         (Range<unsigned_char> *)
         std::
         vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
         ::cend(&this->m_ranges);
    bVar2 = __gnu_cxx::operator!=(&stack0xffffffffffffffd8,&local_58);
    bVar1 = local_29;
    if (!bVar2) break;
    pRVar5 = __gnu_cxx::
             __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
             ::operator->(&stack0xffffffffffffffd8);
    local_59 = Range<unsigned_char>::start(pRVar5);
    std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>::
    emplace_back<unsigned_char&,unsigned_char>
              ((vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>
                *)&__return_storage_ptr__->m_ranges,&local_29,&local_59);
    pRVar5 = __gnu_cxx::
             __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
             ::operator->(&stack0xffffffffffffffd8);
    local_29 = Range<unsigned_char>::end(pRVar5);
    local_68 = (Range<unsigned_char> *)
               __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
               ::operator++(&stack0xffffffffffffffd8,0);
  }
  bVar4 = std::numeric_limits<unsigned_char>::max();
  if (bVar1 < bVar4) {
    local_69 = std::numeric_limits<unsigned_char>::max();
    std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>::
    emplace_back<unsigned_char&,unsigned_char>
              ((vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>
                *)&__return_storage_ptr__->m_ranges,&local_29,&local_69);
  }
  return __return_storage_ptr__;
}

Assistant:

CharClass<TCHAR> operator~() const
    {
        CharClass<TCHAR> cc;

		typename std::vector<Range<TCHAR> >::const_iterator i = m_ranges.cbegin();
		TCHAR last_end = 1;

		if (i != m_ranges.cend())
		{
			if (i->start() == 1)
			{
				last_end = i->end();
				i++;
			}
		}

		for (; i != m_ranges.cend(); i++)
		{
			cc.m_ranges.emplace_back(last_end, i->start());
			last_end = i->end();
		}

		if (last_end < std::numeric_limits<TCHAR>::max())
			cc.m_ranges.emplace_back(last_end, std::numeric_limits<TCHAR>::max());

        return cc;
    }